

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aead128a_enc.c
# Opt level: O3

void test_aead128a_encryption(void)

{
  vecs_ctx_t vVar1;
  vecs_ctx_t vVar2;
  vecs_ctx_t vVar3;
  int iVar4;
  vecs_err_t vVar5;
  long lVar6;
  long lVar7;
  byte bVar8;
  undefined8 uVar9;
  undefined1 *puVar10;
  ulong uVar11;
  long lVar12;
  byte bVar13;
  ulong uVar14;
  undefined1 auVar15 [32];
  undefined1 in_ZMM0 [64];
  uint8_t obtained_ciphertext [1];
  uint8_t obtained_tag [16];
  uint8_t obtained_tag_3 [16];
  ascon_aead_ctx_t ctx;
  ascon_aead_ctx_t aead_ctx;
  vecs_ctx_t local_1a8;
  vecs_ctx_t local_198;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  FILE *local_168;
  size_t sStack_160;
  undefined1 local_158 [40];
  undefined1 local_130 [16];
  uint8_t local_120 [8];
  undefined1 auStack_118 [24];
  undefined1 local_f0 [48];
  undefined1 local_c0 [20];
  undefined1 local_ac [16];
  vecs_ctx_t local_9c;
  uint8_t local_88 [56];
  byte local_50;
  
  auVar15 = in_ZMM0._0_32_;
  puts("Testing Ascon-128a encryption...");
  local_158._0_32_ = vpcmpeqd_avx2(auVar15,auVar15);
  auStack_118 = local_158._8_24_;
  stack0xfffffffffffffec8 = local_158._0_24_;
  local_120 = local_158._24_8_;
  ascon_aead_cleanup();
  lVar6 = 0;
  do {
    if (local_158[lVar6] != '\0') {
      printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
             ,0x16,"test_aead_cleanup",atto_counter);
      atto_at_least_one_fail = '\x01';
      break;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x58);
  memcpy((vecs_aead_t *)local_158,&DAT_00121320,0xd0);
  local_1a8.handle._0_1_ = 0;
  local_198.handle = (FILE *)0x0;
  local_198.key_len = 0;
  ascon_aead128a_encrypt
            (&local_1a8,&local_198,local_c0,local_ac,auStack_118 + 8,local_130,(undefined1  [16])0x0
             ,0x10);
  vecs_aead_enc_log((vecs_aead_t *)local_158,(uint8_t *)&local_1a8,(uint8_t *)&local_198,
                    local_158._16_8_);
  iVar4 = bcmp(&local_1a8,local_f0,local_158._16_8_);
  uVar9 = 0x43;
  if ((iVar4 == 0) && (uVar9 = 0x44, local_198 == local_9c)) {
    local_1a8.handle._0_1_ = 0;
    local_198.handle = (FILE *)0x0;
    local_198.key_len = 0;
    ascon_aead128a_init(local_88,local_c0,local_ac);
    uVar9 = 0x4a;
    if (local_50 != 0) goto LAB_0011156a;
    lVar6 = ascon_aead128a_encrypt_final(local_88,&local_1a8,&local_198,0x10);
    vecs_aead_enc_log((vecs_aead_t *)local_158,(uint8_t *)&local_1a8,(uint8_t *)&local_198,
                      local_158._16_8_);
    uVar9 = 0x51;
    if (lVar6 != 0) goto LAB_0011156a;
    iVar4 = bcmp(&local_1a8,local_f0,local_158._16_8_);
    uVar9 = 0x54;
    if ((iVar4 != 0) || (uVar9 = 0x55, local_198 != local_9c)) goto LAB_0011156a;
    lVar6 = 0;
    do {
      if (local_88[lVar6] != '\0') {
        uVar9 = 0x56;
        goto LAB_0011156a;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x58);
    local_1a8.handle._0_1_ = 0;
    local_198.handle = (FILE *)0x0;
    local_198.key_len = 0;
    ascon_aead128a_init(local_88,local_c0,local_ac);
    ascon_aead128a_assoc_data_update(local_88,0,0);
    ascon_aead128a_assoc_data_update(local_88,&local_1a8,0);
    ascon_aead128a_assoc_data_update(local_88,0,0);
    lVar6 = ascon_aead128a_encrypt_final(local_88,&local_1a8,&local_198,0x10);
    vecs_aead_enc_log((vecs_aead_t *)local_158,(uint8_t *)&local_1a8,(uint8_t *)&local_198,
                      local_158._16_8_);
    uVar9 = 100;
    if (lVar6 != 0) goto LAB_0011156a;
    iVar4 = bcmp(&local_1a8,local_f0,local_158._16_8_);
    uVar9 = 0x67;
    if ((iVar4 != 0) || (uVar9 = 0x68, local_198 != local_9c)) goto LAB_0011156a;
    lVar6 = 0;
    do {
      if (local_88[lVar6] != '\0') {
        uVar9 = 0x69;
        goto LAB_0011156a;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x58);
    local_1a8.handle._0_1_ = 0;
    local_198.handle = (FILE *)0x0;
    local_198.key_len = 0;
    ascon_aead128a_init(local_88,local_c0,local_ac);
    lVar6 = ascon_aead128a_encrypt_update(local_88,0,0,0);
    uVar9 = 0x70;
    if (lVar6 != 0) goto LAB_0011156a;
    lVar6 = ascon_aead128a_encrypt_update(local_88,0,&local_1a8,0);
    uVar9 = 0x73;
    if (lVar6 != 0) goto LAB_0011156a;
    lVar6 = ascon_aead128a_encrypt_update(local_88,0,&local_1a8,0);
    uVar9 = 0x76;
    if (lVar6 != 0) goto LAB_0011156a;
    lVar6 = ascon_aead128a_encrypt_update(local_88,&local_1a8,&local_1a8,0);
    uVar9 = 0x79;
    if (lVar6 != 0) goto LAB_0011156a;
    lVar6 = ascon_aead128a_encrypt_final(local_88,&local_1a8,&local_198,0x10);
    vecs_aead_enc_log((vecs_aead_t *)local_158,(uint8_t *)&local_1a8,(uint8_t *)&local_198,
                      local_158._16_8_);
    uVar9 = 0x7f;
    if (lVar6 != 0) goto LAB_0011156a;
    iVar4 = bcmp(&local_1a8,local_f0,local_158._16_8_);
    uVar9 = 0x81;
    if ((iVar4 != 0) || (uVar9 = 0x82, local_198 != local_9c)) goto LAB_0011156a;
    lVar6 = 0;
    do {
      if (local_88[lVar6] != '\0') {
        uVar9 = 0x83;
        goto LAB_0011156a;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x58);
    local_1a8.handle._0_1_ = 0;
    local_198.handle = (FILE *)0x0;
    local_198.key_len = 0;
    ascon_aead128a_init(local_88,local_c0,local_ac);
    ascon_aead128a_assoc_data_update(local_88,0,0);
    ascon_aead128a_assoc_data_update(local_88,&local_1a8,0);
    ascon_aead128a_assoc_data_update(local_88,0,0);
    lVar6 = ascon_aead128a_encrypt_update(local_88,0,0,0);
    uVar9 = 0x8d;
    if (lVar6 != 0) goto LAB_0011156a;
    lVar6 = ascon_aead128a_encrypt_update(local_88,0,&local_1a8,0);
    uVar9 = 0x90;
    if (lVar6 != 0) goto LAB_0011156a;
    lVar6 = ascon_aead128a_encrypt_update(local_88,0,&local_1a8,0);
    uVar9 = 0x93;
    if (lVar6 != 0) goto LAB_0011156a;
    lVar6 = ascon_aead128a_encrypt_update(local_88,&local_1a8,&local_1a8,0);
    uVar9 = 0x96;
    if (lVar6 != 0) goto LAB_0011156a;
    lVar6 = ascon_aead128a_encrypt_final(local_88,&local_1a8,&local_198,0x10);
    vecs_aead_enc_log((vecs_aead_t *)local_158,(uint8_t *)&local_1a8,(uint8_t *)&local_198,
                      local_158._16_8_);
    uVar9 = 0x9c;
    if (lVar6 != 0) goto LAB_0011156a;
    iVar4 = bcmp(&local_1a8,local_f0,local_158._16_8_);
    uVar9 = 0x9e;
    if ((iVar4 != 0) || (uVar9 = 0x9f, local_198 != local_9c)) goto LAB_0011156a;
    lVar6 = 0;
    do {
      if (local_88[lVar6] != '\0') {
        uVar9 = 0xa0;
        goto LAB_0011156a;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x58);
  }
  else {
LAB_0011156a:
    printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
           ,uVar9,"test_encrypt_empty",atto_counter);
    atto_at_least_one_fail = '\x01';
  }
  memcpy((vecs_aead_t *)local_158,&DAT_001213f0,0xd0);
  local_1a8.handle._0_1_ = 0;
  local_198.handle = (FILE *)0x0;
  local_198.key_len = 0;
  ascon_aead128a_init(local_88,local_c0,local_ac);
  ascon_aead128a_assoc_data_update(local_88,auStack_118 + 8,local_158._8_8_);
  lVar6 = ascon_aead128a_encrypt_final(local_88,&local_1a8,&local_198,0x10);
  vecs_aead_enc_log((vecs_aead_t *)local_158,(uint8_t *)&local_1a8,(uint8_t *)&local_198,
                    local_158._16_8_);
  uVar9 = 0xcc;
  if (lVar6 == 0) {
    iVar4 = bcmp(&local_1a8,local_f0,local_158._16_8_);
    uVar9 = 0xce;
    if ((iVar4 != 0) || (uVar9 = 0xcf, local_198 != local_9c)) goto LAB_0011179c;
    lVar6 = 0;
    do {
      if (local_88[lVar6] != '\0') {
        uVar9 = 0xd0;
        goto LAB_0011179c;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x58);
    local_1a8.handle._0_1_ = 0;
    local_198.handle = (FILE *)0x0;
    local_198.key_len = 0;
    ascon_aead128a_init(local_88,local_c0,local_ac);
    ascon_aead128a_assoc_data_update(local_88,auStack_118 + 8,local_158._8_8_);
    lVar6 = ascon_aead128a_encrypt_update(local_88,&local_1a8,local_130,local_158._0_8_);
    uVar9 = 0xdb;
    if (lVar6 != 0) goto LAB_0011179c;
    lVar6 = ascon_aead128a_encrypt_final(local_88,&local_1a8,&local_198,0x10);
    vecs_aead_enc_log((vecs_aead_t *)local_158,(uint8_t *)&local_1a8,(uint8_t *)&local_198,
                      local_158._16_8_);
    uVar9 = 0xe1;
    if (lVar6 != 0) goto LAB_0011179c;
    iVar4 = bcmp(&local_1a8,local_f0,local_158._16_8_);
    uVar9 = 0xe4;
    if ((iVar4 != 0) || (uVar9 = 0xe5, local_198 != local_9c)) goto LAB_0011179c;
    lVar6 = 0;
    do {
      if (local_88[lVar6] != '\0') {
        uVar9 = 0xe6;
        goto LAB_0011179c;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x58);
  }
  else {
LAB_0011179c:
    printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
           ,uVar9,"test_encrypt_1_byte_ad_empty_pt",atto_counter);
    atto_at_least_one_fail = '\x01';
  }
  memcpy(local_158,&DAT_001214c0,0xd0);
  local_198 = (vecs_ctx_t)ZEXT816(0);
  uStack_188 = 0;
  uStack_180 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  local_1a8.handle = (FILE *)0x0;
  local_1a8.key_len = 0;
  ascon_aead128a_init(local_88,local_c0,local_ac);
  lVar6 = ascon_aead128a_encrypt_update(local_88,&local_198,local_130,local_158._0_8_);
  uVar9 = 0x10e;
  if (lVar6 == 0) {
    lVar6 = ascon_aead128a_encrypt_final(local_88,&local_198,&local_1a8,0x10);
    vecs_aead_enc_log((vecs_aead_t *)local_158,(uint8_t *)&local_198,(uint8_t *)&local_1a8,
                      local_158._16_8_);
    uVar9 = 0x114;
    if (lVar6 != 1) goto LAB_00111a03;
    iVar4 = bcmp(&local_198,local_f0,local_158._16_8_);
    uVar9 = 0x116;
    if ((iVar4 != 0) || (uVar9 = 0x117, local_1a8 != local_9c)) goto LAB_00111a03;
    lVar6 = 0;
    do {
      if (local_88[lVar6] != '\0') {
        uVar9 = 0x118;
        goto LAB_00111a03;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x58);
    uStack_178 = 0;
    uStack_170 = 0;
    local_198 = (vecs_ctx_t)ZEXT816(0);
    uStack_188 = 0;
    uStack_180 = 0;
    local_1a8.handle = (FILE *)0x0;
    local_1a8.key_len = 0;
    ascon_aead128a_init(local_88,local_c0,local_ac);
    ascon_aead128a_assoc_data_update(local_88,auStack_118 + 8,local_158._8_8_);
    lVar6 = ascon_aead128a_encrypt_update(local_88,&local_198,local_130,local_158._0_8_);
    uVar9 = 0x123;
    if (lVar6 != 0) goto LAB_00111a03;
    lVar6 = ascon_aead128a_encrypt_final(local_88,&local_198,&local_1a8,0x10);
    vecs_aead_enc_log((vecs_aead_t *)local_158,(uint8_t *)&local_198,(uint8_t *)&local_1a8,
                      local_158._16_8_);
    uVar9 = 0x129;
    if (lVar6 != 1) goto LAB_00111a03;
    iVar4 = bcmp(&local_198,local_f0,local_158._16_8_);
    uVar9 = 300;
    if ((iVar4 != 0) || (uVar9 = 0x12d, local_1a8 != local_9c)) goto LAB_00111a03;
    lVar6 = 0;
    do {
      if (local_88[lVar6] != '\0') {
        uVar9 = 0x12e;
        goto LAB_00111a03;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x58);
  }
  else {
LAB_00111a03:
    printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
           ,uVar9,"test_encrypt_1_byte_pt_empty_ad",atto_counter);
    atto_at_least_one_fail = '\x01';
  }
  memcpy(local_158,&DAT_00121590,0xd0);
  local_198 = (vecs_ctx_t)ZEXT816(0);
  uStack_188 = 0;
  uStack_180 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  local_1a8.handle = (FILE *)0x0;
  local_1a8.key_len = 0;
  ascon_aead128a_init(local_88,local_c0,local_ac);
  ascon_aead128a_assoc_data_update(local_88,auStack_118 + 8,local_158._8_8_);
  lVar6 = ascon_aead128a_encrypt_update(local_88,&local_198,local_130,local_158._0_8_);
  uVar9 = 0x157;
  if (lVar6 == 0) {
    lVar6 = ascon_aead128a_encrypt_final(local_88,&local_198,&local_1a8,0x10);
    vecs_aead_enc_log((vecs_aead_t *)local_158,(uint8_t *)&local_198,(uint8_t *)&local_1a8,
                      local_158._16_8_);
    uVar9 = 0x15d;
    if (lVar6 == 1) {
      iVar4 = bcmp(&local_198,local_f0,local_158._16_8_);
      uVar9 = 0x160;
      if (iVar4 == 0) {
        lVar6 = 0;
        do {
          if (local_88[lVar6] != '\0') {
            uVar9 = 0x161;
            goto LAB_00111b3c;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x58);
        goto LAB_00111b6c;
      }
    }
  }
LAB_00111b3c:
  printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
         "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
         ,uVar9,"test_encrypt_1_byte_pt_1_byte_ad",atto_counter);
  atto_at_least_one_fail = '\x01';
LAB_00111b6c:
  vVar5 = vecs_init(&local_198,"vectors/aead128a.txt",0x10);
  if (vVar5 == VECS_OK) {
    do {
      vVar5 = vecs_aead_next(&local_198,(vecs_aead_t *)local_158);
      if (vVar5 == VECS_EOF) goto LAB_00111bbf;
      atto_counter = local_158._24_8_;
      if (vVar5 != VECS_OK) {
        uVar9 = 0x175;
        goto LAB_00111bae;
      }
      if (local_158._0_8_ != local_158._16_8_) {
        uVar9 = 0x176;
        goto LAB_00111bae;
      }
      local_88[0x20] = '\0';
      local_88[0x21] = '\0';
      local_88[0x22] = '\0';
      local_88[0x23] = '\0';
      local_88[0x24] = '\0';
      local_88[0x25] = '\0';
      local_88[0x26] = '\0';
      local_88[0x27] = '\0';
      local_88[0x28] = '\0';
      local_88[0x29] = '\0';
      local_88[0x2a] = '\0';
      local_88[0x2b] = '\0';
      local_88[0x2c] = '\0';
      local_88[0x2d] = '\0';
      local_88[0x2e] = '\0';
      local_88[0x2f] = '\0';
      local_88[0] = '\0';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      local_88[8] = '\0';
      local_88[9] = '\0';
      local_88[10] = '\0';
      local_88[0xb] = '\0';
      local_88[0xc] = '\0';
      local_88[0xd] = '\0';
      local_88[0xe] = '\0';
      local_88[0xf] = '\0';
      local_88[0x10] = '\0';
      local_88[0x11] = '\0';
      local_88[0x12] = '\0';
      local_88[0x13] = '\0';
      local_88[0x14] = '\0';
      local_88[0x15] = '\0';
      local_88[0x16] = '\0';
      local_88[0x17] = '\0';
      local_88[0x18] = '\0';
      local_88[0x19] = '\0';
      local_88[0x1a] = '\0';
      local_88[0x1b] = '\0';
      local_88[0x1c] = '\0';
      local_88[0x1d] = '\0';
      local_88[0x1e] = '\0';
      local_88[0x1f] = '\0';
      local_1a8.handle = (FILE *)0x0;
      local_1a8.key_len = 0;
      ascon_aead128a_encrypt
                (local_88,&local_1a8,local_c0,local_ac,auStack_118 + 8,local_130,local_158._8_8_,
                 local_158._0_8_,0x10);
      vecs_aead_enc_log((vecs_aead_t *)local_158,local_88,(uint8_t *)&local_1a8,local_158._16_8_);
      iVar4 = bcmp(local_88,local_f0,local_158._16_8_);
      if (iVar4 != 0) {
        uVar9 = 0x186;
        goto LAB_00111bae;
      }
    } while (local_1a8 == local_9c);
    uVar9 = 0x187;
  }
  else {
    uVar9 = 0x16b;
  }
LAB_00111bae:
  printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
         "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
         ,uVar9,"test_encrypt_offline",atto_counter);
  atto_at_least_one_fail = '\x01';
LAB_00111bbf:
  vVar5 = vecs_init(&local_1a8,"vectors/aead128a.txt",0x10);
  if (vVar5 == VECS_OK) {
    vVar5 = vecs_aead_next(&local_1a8,(vecs_aead_t *)local_158);
    if (vVar5 != VECS_EOF) {
      do {
        puVar10 = auStack_118 + 8;
        atto_counter = local_158._24_8_;
        if (vVar5 != VECS_OK) {
          uVar9 = 0x19f;
LAB_0011216e:
          printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
                 ,uVar9,"test_encrypt_update_single_byte",atto_counter);
LAB_00112178:
          atto_at_least_one_fail = '\x01';
          break;
        }
        if (local_158._0_8_ != local_158._16_8_) {
          uVar9 = 0x1a0;
          goto LAB_0011216e;
        }
        uStack_178 = 0;
        uStack_170 = 0;
        local_198 = (vecs_ctx_t)ZEXT816(0);
        uStack_188 = 0;
        uStack_180 = 0;
        local_168 = (FILE *)0x0;
        sStack_160 = 0;
        ascon_aead128a_init(local_88,local_c0,local_ac);
        bVar13 = 1;
        uVar11 = 0;
        while (uVar11 < (ulong)local_158._8_8_) {
          ascon_aead128a_assoc_data_update(local_88,puVar10,1);
          uVar11 = uVar11 + 1;
          bVar8 = bVar13 & 0xf;
          bVar13 = bVar13 + 1;
          puVar10 = puVar10 + 1;
          if (bVar8 != local_50) {
            uVar9 = 0x1aa;
            goto LAB_00111f9a;
          }
        }
        if (local_158._0_8_ != 0) {
          uVar11 = 0;
          lVar6 = 0;
LAB_00111e32:
          lVar12 = ascon_aead128a_encrypt_update
                             (local_88,(long)&local_198.handle + lVar6,local_130 + uVar11,1);
          uVar11 = uVar11 + 1;
          if (((uint)uVar11 & 0xf) != (uint)local_50) {
            uVar9 = 0x1b5;
            goto LAB_00111f9a;
          }
          if (local_50 != 0) {
            if (lVar12 != 0) {
              uVar9 = 0x1bc;
              goto LAB_00111f9a;
            }
LAB_00111e83:
            lVar6 = lVar6 + lVar12;
            if ((ulong)local_158._0_8_ <= uVar11) goto LAB_00111e91;
            goto LAB_00111e32;
          }
          if (lVar12 == 0x10) goto LAB_00111e83;
          uVar9 = 0x1b8;
LAB_00111f9a:
          printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
                 ,uVar9,"test_encrypt_update_single_byte",atto_counter);
          goto LAB_00112178;
        }
        lVar6 = 0;
LAB_00111e91:
        uVar11 = ascon_aead128a_encrypt_final
                           (local_88,(long)&local_198.handle + lVar6,&local_168,0x10);
        if (0xf < uVar11) {
          uVar9 = 0x1c4;
          goto LAB_0011216e;
        }
        if (uVar11 != (local_158._16_4_ & 0xf)) {
          uVar9 = 0x1c5;
          goto LAB_0011216e;
        }
        if (uVar11 + lVar6 != local_158._16_8_) {
          uVar9 = 0x1c6;
          goto LAB_0011216e;
        }
        vecs_aead_enc_log((vecs_aead_t *)local_158,(uint8_t *)&local_198,(uint8_t *)&local_168,
                          uVar11 + lVar6);
        iVar4 = bcmp(&local_198,local_f0,local_158._16_8_);
        if (iVar4 != 0) {
          uVar9 = 0x1cb;
          goto LAB_0011216e;
        }
        vVar1.key_len = sStack_160;
        vVar1.handle = local_168;
        if (vVar1 != local_9c) {
          uVar9 = 0x1cc;
          goto LAB_0011216e;
        }
        lVar6 = 0;
        do {
          if (local_88[lVar6] != '\0') {
            uVar9 = 0x1cd;
            goto LAB_0011216e;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x58);
        vVar5 = vecs_aead_next(&local_1a8,(vecs_aead_t *)local_158);
      } while (vVar5 != VECS_EOF);
    }
  }
  else {
    printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
           ,0x192,"test_encrypt_update_single_byte",atto_counter);
    atto_at_least_one_fail = '\x01';
  }
  vVar5 = vecs_init(&local_1a8,"vectors/aead128a.txt",0x10);
  if (vVar5 == VECS_OK) {
    vVar5 = vecs_aead_next(&local_1a8,(vecs_aead_t *)local_158);
    if (vVar5 != VECS_EOF) {
      do {
        atto_counter = local_158._24_8_;
        if (vVar5 != VECS_OK) {
          uVar9 = 0x1e6;
          goto LAB_001121c7;
        }
        if (local_158._0_8_ != local_158._16_8_) {
          uVar9 = 0x1e7;
          goto LAB_001121c7;
        }
        uStack_178 = 0;
        uStack_170 = 0;
        local_198 = (vecs_ctx_t)ZEXT816(0);
        uStack_188 = 0;
        uStack_180 = 0;
        local_168 = (FILE *)0x0;
        sStack_160 = 0;
        ascon_aead128a_init(local_88,local_c0,local_ac);
        if (local_158._8_8_ != 0) {
          lVar6 = 0;
          uVar11 = local_158._8_8_;
          do {
            uVar14 = 3;
            if (uVar11 < 3) {
              uVar14 = uVar11;
            }
            ascon_aead128a_assoc_data_update(local_88,auStack_118 + lVar6 + 8,uVar14);
            lVar6 = lVar6 + uVar14;
            if (((uint)lVar6 & 0xf) != (uint)local_50) {
              uVar9 = 0x1f7;
              goto LAB_001121c7;
            }
            uVar11 = uVar11 - uVar14;
          } while (uVar11 != 0);
        }
        if (local_158._0_8_ == 0) {
          lVar6 = 0;
        }
        else {
          lVar12 = 0;
          lVar6 = 0;
          uVar11 = local_158._0_8_;
          bVar13 = 0;
          do {
            uVar14 = 3;
            if (uVar11 < 3) {
              uVar14 = uVar11;
            }
            lVar7 = ascon_aead128a_encrypt_update
                              (local_88,(long)&local_198.handle + lVar6,local_130 + lVar12,uVar14);
            lVar12 = lVar12 + uVar14;
            if (((uint)lVar12 & 0xf) != (uint)local_50) {
              uVar9 = 0x208;
              goto LAB_001127be;
            }
            if (local_50 < bVar13) {
              if (lVar7 != 0x10) {
                uVar9 = 0x20b;
                goto LAB_001127be;
              }
            }
            else if (lVar7 != 0) {
              uVar9 = 0x20f;
              goto LAB_001127be;
            }
            lVar6 = lVar6 + lVar7;
            uVar11 = uVar11 - uVar14;
            bVar13 = local_50;
          } while (uVar11 != 0);
        }
        uVar11 = ascon_aead128a_encrypt_final
                           (local_88,(long)&local_198.handle + lVar6,&local_168,0x10);
        if (0xf < uVar11) {
          uVar9 = 0x21a;
LAB_001127be:
          printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
                 ,uVar9,"test_encrypt_update_three_bytes",atto_counter);
          goto LAB_001121d1;
        }
        if (uVar11 != (local_158._16_4_ & 0xf)) {
          uVar9 = 0x21b;
          goto LAB_001127be;
        }
        if (uVar11 + lVar6 != local_158._16_8_) {
          uVar9 = 0x21c;
          goto LAB_001127be;
        }
        vecs_aead_enc_log((vecs_aead_t *)local_158,(uint8_t *)&local_198,(uint8_t *)&local_168,
                          uVar11 + lVar6);
        iVar4 = bcmp(&local_198,local_f0,local_158._16_8_);
        if (iVar4 != 0) {
          uVar9 = 0x221;
          goto LAB_001121c7;
        }
        vVar2.key_len = sStack_160;
        vVar2.handle = local_168;
        if (vVar2 != local_9c) {
          uVar9 = 0x222;
          goto LAB_001121c7;
        }
        lVar6 = 0;
        do {
          if (local_88[lVar6] != '\0') {
            uVar9 = 0x223;
            goto LAB_001121c7;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x58);
        vVar5 = vecs_aead_next(&local_1a8,(vecs_aead_t *)local_158);
      } while (vVar5 != VECS_EOF);
    }
  }
  else {
    uVar9 = 0x1d9;
LAB_001121c7:
    printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
           ,uVar9,"test_encrypt_update_three_bytes",atto_counter);
LAB_001121d1:
    atto_at_least_one_fail = '\x01';
  }
  vVar5 = vecs_init(&local_1a8,"vectors/aead128a.txt",0x10);
  if (vVar5 == VECS_OK) {
    vVar5 = vecs_aead_next(&local_1a8,(vecs_aead_t *)local_158);
    if (vVar5 != VECS_EOF) {
      do {
        atto_counter = local_158._24_8_;
        if (vVar5 != VECS_OK) {
          uVar9 = 0x23c;
          goto LAB_00112220;
        }
        if (local_158._0_8_ != local_158._16_8_) {
          uVar9 = 0x23d;
          goto LAB_00112220;
        }
        uStack_178 = 0;
        uStack_170 = 0;
        local_198 = (vecs_ctx_t)ZEXT816(0);
        uStack_188 = 0;
        uStack_180 = 0;
        local_168 = (FILE *)0x0;
        sStack_160 = 0;
        ascon_aead128a_init(local_88,local_c0,local_ac);
        if (local_158._8_8_ != 0) {
          lVar6 = 0;
          uVar11 = 0;
          uVar14 = local_158._8_8_;
          do {
            uVar11 = uVar11 + 1;
            if (uVar14 < uVar11) {
              uVar11 = uVar14;
            }
            ascon_aead128a_assoc_data_update(local_88,auStack_118 + lVar6 + 8,uVar11);
            lVar6 = lVar6 + uVar11;
            if (((uint)lVar6 & 0xf) != (uint)local_50) {
              uVar9 = 0x24c;
              goto LAB_00112220;
            }
            uVar14 = uVar14 - uVar11;
          } while (uVar14 != 0);
        }
        if (local_158._0_8_ == 0) {
          lVar6 = 0;
        }
        else {
          lVar12 = 0;
          uVar11 = 0;
          lVar6 = 0;
          uVar14 = local_158._0_8_;
          do {
            uVar11 = uVar11 + 1;
            if (uVar14 < uVar11) {
              uVar11 = uVar14;
            }
            lVar7 = ascon_aead128a_encrypt_update
                              (local_88,(long)&local_198.handle + lVar6,local_130 + lVar12,uVar11);
            lVar12 = lVar12 + uVar11;
            if (((uint)lVar12 & 0xf) != (uint)local_50) {
              uVar9 = 0x25e;
              goto LAB_00112220;
            }
            lVar6 = lVar6 + lVar7;
            uVar14 = uVar14 - uVar11;
          } while (uVar14 != 0);
        }
        uVar11 = ascon_aead128a_encrypt_final
                           (local_88,(long)&local_198.handle + lVar6,&local_168,0x10);
        if (0xf < uVar11) {
          uVar9 = 0x267;
          goto LAB_00112220;
        }
        if (uVar11 != (local_158._16_4_ & 0xf)) {
          uVar9 = 0x268;
          goto LAB_00112220;
        }
        if (uVar11 + lVar6 != local_158._16_8_) {
          uVar9 = 0x269;
          goto LAB_00112220;
        }
        vecs_aead_enc_log((vecs_aead_t *)local_158,(uint8_t *)&local_198,(uint8_t *)&local_168,
                          uVar11 + lVar6);
        iVar4 = bcmp(&local_198,local_f0,local_158._16_8_);
        if (iVar4 != 0) {
          uVar9 = 0x26e;
          goto LAB_00112220;
        }
        vVar3.key_len = sStack_160;
        vVar3.handle = local_168;
        if (vVar3 != local_9c) {
          uVar9 = 0x26f;
          goto LAB_00112220;
        }
        lVar6 = 0;
        do {
          if (local_88[lVar6] != '\0') {
            uVar9 = 0x270;
            goto LAB_00112220;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x58);
        vVar5 = vecs_aead_next(&local_1a8,(vecs_aead_t *)local_158);
      } while (vVar5 != VECS_EOF);
    }
  }
  else {
    uVar9 = 0x22f;
LAB_00112220:
    printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
           ,uVar9,"test_encrypt_update_var_bytes",atto_counter);
    atto_at_least_one_fail = '\x01';
  }
  return;
}

Assistant:

void test_aead128a_encryption(void)
{
    puts("Testing Ascon-128a encryption...");
    test_aead_cleanup();
    test_encrypt_empty();
    test_encrypt_1_byte_ad_empty_pt();
    test_encrypt_1_byte_pt_empty_ad();
    test_encrypt_1_byte_pt_1_byte_ad();
    test_encrypt_offline();
    test_encrypt_update_single_byte();
    test_encrypt_update_three_bytes();
    test_encrypt_update_var_bytes();
}